

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O2

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  size_type sVar1;
  unique_lock<std::mutex> m;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->mutex);
  sVar1 = std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>::
          size((deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_> *)
               this);
  if (this->max_size <= sVar1) {
    std::condition_variable::
    wait<NotLockFreeQueue<std::packaged_task<void()>>::push_and_wait(std::packaged_task<void()>&&)::_lambda()_1_>
              (&this->cond_var_push,&local_20,(anon_class_8_1_8991fb9c)this);
  }
  std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>::
  emplace_back<std::packaged_task<void()>>
            ((deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>> *)this,
             item);
  std::unique_lock<std::mutex>::unlock(&local_20);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void NotLockFreeQueue<T>::push_and_wait(T&& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.size() >= max_size) {
        cond_var_push.wait(m, [this]{return queue.size() < max_size;});
    }
    queue.push(std::move(item));
    m.unlock();
    cond_var_pop.notify_one();
}